

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

IDiagObjectAddress * __thiscall
Js::DiagScopeVariablesWalker::FindPropertyAddress
          (DiagScopeVariablesWalker *this,PropertyId propId,bool *isConst)

{
  Type pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppIVar6;
  undefined4 extraout_var;
  int index;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  GetChildrenCount(this);
  if (this->pDiagScopeObjects !=
      (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = this->pDiagScopeObjects;
    index = 0;
    if (0 < (this_00->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        ppIVar6 = JsUtil::
                  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,index);
        pIVar1 = *ppIVar6;
        if (pIVar1 == (Type)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x418,"(pObjWalker)","pObjWalker");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[3])(pIVar1,(ulong)(uint)propId,isConst);
        if ((IDiagObjectAddress *)CONCAT44(extraout_var,iVar4) != (IDiagObjectAddress *)0x0) break;
        index = index + 1;
        this_00 = this->pDiagScopeObjects;
        if ((this_00->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count <= index) {
          return (IDiagObjectAddress *)0x0;
        }
      }
      return (IDiagObjectAddress *)CONCAT44(extraout_var,iVar4);
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress * DiagScopeVariablesWalker::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        IDiagObjectAddress * address = nullptr;

        // Ensure that children are fetched.
        GetChildrenCount();

        if (pDiagScopeObjects)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                Assert(pObjWalker);

                address = pObjWalker->FindPropertyAddress(propId, isConst);
                if (address != nullptr)
                {
                    break;
                }
            }
        }

        return address;
    }